

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::setSelection(Mesh *this,int pickID,Selection *selection)

{
  bool bVar1;
  iterator this_00;
  mapped_type *ppHVar2;
  undefined8 *in_RDX;
  undefined8 in_RDI;
  key_type *in_stack_00000008;
  map<int,_CMU462::HalfedgeElement_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::HalfedgeElement_*>_>_>
  *in_stack_00000010;
  map<int,_CMU462::HalfedgeElement_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::HalfedgeElement_*>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  
  this_00 = std::
            map<int,_CMU462::HalfedgeElement_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::HalfedgeElement_*>_>_>
            ::find(in_stack_ffffffffffffffc8,(key_type *)0x20247d);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_CMU462::HalfedgeElement_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::HalfedgeElement_*>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,&local_28);
  if (bVar1) {
    Selection::clear((Selection *)this_00._M_node);
    *in_RDX = in_RDI;
    ppHVar2 = std::
              map<int,_CMU462::HalfedgeElement_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::HalfedgeElement_*>_>_>
              ::operator[](in_stack_00000010,in_stack_00000008);
    in_RDX[1] = *ppHVar2;
  }
  return;
}

Assistant:

void Mesh::setSelection(int pickID, Selection &selection) {
  // Set the selection to the element specified by the given picking ID;
  // these values were generated in Mesh::draw_pick.
  if (idToElement.find(pickID) != idToElement.end()) {
    selection.clear();
    selection.object = this;
    selection.element = idToElement[pickID];
  }
}